

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

double __thiscall logger::log(logger *this,double __x)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  undefined8 *in_RDX;
  int in_ESI;
  double extraout_XMM0_Qa;
  double dVar3;
  
  __s = levels[in_ESI];
  syslog(in_ESI,"[%s] %s",__s,*in_RDX);
  if (this->ll < in_ESI) {
    return extraout_XMM0_Qa;
  }
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*in_RDX,in_RDX[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  dVar3 = (double)std::ostream::flush();
  return dVar3;
}

Assistant:

void logger::log(int level, std::string const & msg) {
    syslog(level, "[%s] %s", levels[level], msg.c_str());
    if (level <= ll) {
        auto ts = timestamp();
        std::cerr << ts / 1000 << "." << ts % 1000 << " [" << levels[level] << "]" << " " << msg << std::endl;
    }
}